

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3DbStrDup(sqlite3 *db,char *z)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  u64 n;
  
  if (z != (char *)0x0) {
    sVar1 = strlen(z);
    n = sVar1 + 1;
    if (db == (sqlite3 *)0x0) {
      __dest = sqlite3Malloc(n);
    }
    else {
      __dest = sqlite3DbMallocRawNN(db,n);
    }
    if (__dest != (void *)0x0) {
      pcVar2 = (char *)memcpy(__dest,z,n);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrDup(sqlite3 *db, const char *z){
  char *zNew;
  size_t n;
  if( z==0 ){
    return 0;
  }
  n = strlen(z) + 1;
  zNew = sqlite3DbMallocRaw(db, n);
  if( zNew ){
    memcpy(zNew, z, n);
  }
  return zNew;
}